

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_gsl.cpp
# Opt level: O0

void __thiscall
GslSpan_FromStdArrayConstConstructor_Test::~GslSpan_FromStdArrayConstConstructor_Test
          (GslSpan_FromStdArrayConstConstructor_Test *this)

{
  GslSpan_FromStdArrayConstConstructor_Test *this_local;
  
  ~GslSpan_FromStdArrayConstConstructor_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST (GslSpan, FromStdArrayConstConstructor) {
    std::array<const int, 4> arr = {{1, 2, 3, 4}};

    {
        span<const int> s{arr};
        EXPECT_EQ (s.size (), static_cast<std::ptrdiff_t> (arr.size ()));
        EXPECT_EQ (s.data (), arr.data ());
    }
    {
        span<const int, 4> s{arr};
        EXPECT_EQ (s.size (), static_cast<std::ptrdiff_t> (arr.size ()));
        EXPECT_EQ (s.data (), arr.data ());
    }

#ifdef CONFIRM_COMPILATION_ERRORS
    {
        span<const int, 2> s{arr};
        EXPECT_EQ (s.size () == 2 && s.data (), arr.data ());
    }
    {
        span<const int, 0> s{arr};
        EXPECT_EQ (s.size () == 0 && s.data (), arr.data ());
    }
    { span<const int, 5> s{arr}; }
    { span<int, 4> s{arr}; }
#endif

    {
        auto s = make_span (arr);
        EXPECT_EQ (s.size (), static_cast<std::ptrdiff_t> (arr.size ()));
        EXPECT_EQ (s.data (), arr.data ());
    }
}